

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9_value_double(jx9_value *pVal,double Value)

{
  sxi32 sVar1;
  
  jx9MemObjRelease(pVal);
  (pVal->x).rVal = Value;
  pVal->iFlags = pVal->iFlags & 0xfffffe90U | 4;
  sVar1 = jx9MemObjTryInteger(pVal);
  return sVar1;
}

Assistant:

JX9_PRIVATE int jx9_value_double(jx9_value *pVal, double Value)
{
	/* Invalidate any prior representation */
	jx9MemObjRelease(pVal);
	pVal->x.rVal = (jx9_real)Value;
	MemObjSetType(pVal, MEMOBJ_REAL);
	/* Try to get an integer representation also */
	jx9MemObjTryInteger(pVal);
	return JX9_OK;
}